

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

int limit_xm_resize(void *f,long n)

{
  int32 iVar1;
  DUMBFILE_SYSTEM *pDVar2;
  DUMBFILE_SYSTEM *in_RSI;
  long in_RDI;
  uchar *buffered;
  LIMITED_XM *lx;
  DUMBFILE *df;
  DUMBFILE *f_00;
  
  f_00 = *(DUMBFILE **)(in_RDI + 8);
  if ((f_00->dfs == (DUMBFILE_SYSTEM *)0x0) && (in_RSI == (DUMBFILE_SYSTEM *)0x0)) {
    if (f_00->dfs != (DUMBFILE_SYSTEM *)0x0) {
      free(f_00->dfs);
    }
    f_00->dfs = (DUMBFILE_SYSTEM *)0x0;
    f_00[1].dfs = (DUMBFILE_SYSTEM *)0x0;
  }
  else {
    if ((long)f_00[1].dfs < (long)in_RSI) {
      pDVar2 = (DUMBFILE_SYSTEM *)realloc(f_00->dfs,(size_t)in_RSI);
      if (pDVar2 == (DUMBFILE_SYSTEM *)0x0) {
        return -1;
      }
      f_00->dfs = pDVar2;
      memset((void *)((long)&(f_00[1].dfs)->open + (long)&pDVar2->open),0,
             (long)in_RSI - (long)f_00[1].dfs);
      f_00[1].dfs = in_RSI;
    }
    iVar1 = dumbfile_getnc((char *)in_RSI,(int32)((ulong)in_RDI >> 0x20),f_00);
    if ((long)iVar1 < (long)in_RSI) {
      return -1;
    }
  }
  f_00->pos = (long)in_RSI;
  f_00->file = (void *)0x0;
  return 0;
}

Assistant:

static int DUMBCALLBACK limit_xm_resize(void *f, long n)
{
	DUMBFILE *df = f;
	LIMITED_XM *lx = df->file;
	if (lx->buffered || n) {
		if (n > lx->allocated) {
			unsigned char *buffered = realloc( lx->buffered, n );
			if ( !buffered ) return -1;
			lx->buffered = buffered;
			memset( buffered + lx->allocated, 0, n - lx->allocated );
			lx->allocated = n;
		}
        if ( dumbfile_getnc( (char *)lx->buffered, n, lx->remaining ) < n ) return -1;
	} else if (!n) {
		if ( lx->buffered ) free( lx->buffered );
		lx->buffered = NULL;
		lx->allocated = 0;
	}
	lx->limit = n;
	lx->ptr = 0;
	return 0;
}